

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

void rr::pa::TriangleFan::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
               (__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  VertexPacket *pVVar1;
  VertexPacket *pVVar2;
  VertexPacket *pVVar3;
  ulong uVar4;
  
  if (numVertices != 0) {
    pVVar1 = *vertices;
    for (uVar4 = 2; uVar4 < numVertices; uVar4 = uVar4 + 1) {
      pVVar2 = vertices[uVar4 - 1];
      pVVar3 = (vertices + (uVar4 - 1))[1];
      (outputIterator._M_current)->v0 = pVVar1;
      (outputIterator._M_current)->v1 = pVVar2;
      (outputIterator._M_current)->v2 = pVVar3;
      (outputIterator._M_current)->provokingIndex =
           2 - (uint)(provokingConvention == PROVOKINGVERTEX_FIRST);
      outputIterator._M_current = outputIterator._M_current + 1;
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices == 0)
		{
		}
		else
		{
			const int			provokingOffset	= (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (1) : (2);
			VertexPacket* const	first			= vertices[0];

			for (size_t ndx = 1; ndx + 1 < numVertices; ++ndx)
				*(outputIterator++) = Triangle(first, vertices[ndx], vertices[ndx+1], provokingOffset);
		}
	}